

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void ptrlist_iter_split_current(ptr_list_iter *self)

{
  char cVar1;
  int iVar2;
  
  cVar1 = '\x1d';
  if (N_ != '\0') {
    cVar1 = '\x02';
  }
  if (cVar1 == *(char *)self->__list) {
    ptrlist_split_node(self->__list);
    iVar2 = (int)*(char *)self->__list;
    if (iVar2 <= self->__nr) {
      self->__nr = self->__nr - iVar2;
      self->__list = self->__list->next_;
    }
  }
  return;
}

Assistant:

void ptrlist_iter_split_current(struct ptr_list_iter *self)
{
	if (self->__list->nr_ == N_) {
		/* full so split */
		ptrlist_split_node(self->__list);
		if (self->__nr >= self->__list->nr_) {
			self->__nr -= self->__list->nr_;
			self->__list = self->__list->next_;
		}
	}
}